

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

uint32_t simdjson::internal::detect_supported_architectures(void)

{
  long lVar1;
  uint uVar2;
  uint32_t c;
  
  lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
  uVar2 = *(uint *)(lVar1 + 4);
  lVar1 = cpuid_Version_info(1);
  return (*(uint *)(lVar1 + 0xc) >> 0x11 & 8 |
         uVar2 >> 2 & 0x40 | (uVar2 >> 3 & 4) + (uVar2 & 8) * 4) + (*(uint *)(lVar1 + 0xc) & 2) * 8;
}

Assistant:

static inline uint32_t detect_supported_architectures() {
  uint32_t eax, ebx, ecx, edx;
  uint32_t host_isa = 0x0;

  // ECX for EAX=0x7
  eax = 0x7;
  ecx = 0x0;
  cpuid(&eax, &ebx, &ecx, &edx);
  if (ebx & cpuid_avx2_bit) {
    host_isa |= instruction_set::AVX2;
  }
  if (ebx & cpuid_bmi1_bit) {
    host_isa |= instruction_set::BMI1;
  }

  if (ebx & cpuid_bmi2_bit) {
    host_isa |= instruction_set::BMI2;
  }

  // EBX for EAX=0x1
  eax = 0x1;
  cpuid(&eax, &ebx, &ecx, &edx);

  if (ecx & cpuid_sse42_bit) {
    host_isa |= instruction_set::SSE42;
  }

  if (ecx & cpuid_pclmulqdq_bit) {
    host_isa |= instruction_set::PCLMULQDQ;
  }

  return host_isa;
}